

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::
     ReadPackedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
               (CodedInputStream *input,RepeatedField<unsigned_long> *values)

{
  uint8 *puVar1;
  Limit limit;
  int iVar2;
  unsigned_long uVar3;
  bool bVar4;
  pair<unsigned_long,_bool> pVar5;
  
  puVar1 = input->buffer_;
  if ((puVar1 < input->buffer_end_) && (iVar2 = (int)(char)*puVar1, -1 < (char)*puVar1)) {
    input->buffer_ = puVar1 + 1;
    bVar4 = true;
  }
  else {
    iVar2 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
    bVar4 = -1 < iVar2;
  }
  if (bVar4) {
    limit = io::CodedInputStream::PushLimit(input,iVar2);
    while( true ) {
      iVar2 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar2 < 1) break;
      puVar1 = input->buffer_;
      if ((puVar1 < input->buffer_end_) && (uVar3 = (unsigned_long)(char)*puVar1, -1 < (long)uVar3))
      {
        input->buffer_ = puVar1 + 1;
        pVar5._8_8_ = 1;
        pVar5.first = (unsigned_long)(puVar1 + 1);
      }
      else {
        pVar5 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar3 = pVar5.first;
      }
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_004c7037;
      if (values->current_size_ == values->total_size_) {
        RepeatedField<unsigned_long>::Reserve(values,values->total_size_ + 1);
      }
      iVar2 = values->current_size_;
      values->current_size_ = iVar2 + 1;
      values->rep_->elements[iVar2] = uVar3;
    }
    io::CodedInputStream::PopLimit(input,limit);
    bVar4 = true;
  }
  else {
LAB_004c7037:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

inline bool WireFormatLite::ReadPackedPrimitive(io::CodedInputStream* input,
                                                RepeatedField<CType>* values) {
  int length;
  if (!input->ReadVarintSizeAsInt(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    CType value;
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->Add(value);
  }
  input->PopLimit(limit);
  return true;
}